

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye_model.hpp
# Opt level: O1

void __thiscall
FisheyeModel::setUndistortParams
          (FisheyeModel *this,int undist_flags,Size *undist_size,double undist_scale,
          Point2f *undist_offset)

{
  Size *pSVar1;
  Mat *pMVar2;
  Mat *pMVar3;
  Size *pSVar4;
  float fVar5;
  size_t sVar6;
  _InputArray *p_Var7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar8;
  _InputArray local_118;
  _InputArray local_100;
  undefined1 local_e8 [16];
  _InputArray local_d8;
  Mat new_camera_matrix;
  _OutputArray local_60;
  _OutputArray local_48;
  
  local_e8._8_4_ = in_XMM0_Dc;
  local_e8._0_8_ = undist_scale;
  local_e8._12_4_ = in_XMM0_Dd;
  cv::Mat::Mat(&new_camera_matrix);
  pSVar1 = &(this->super_BaseModel).imageSize;
  if (undist_size->height == 0 && undist_size->width == 0) {
    undist_size = pSVar1;
  }
  (this->super_BaseModel).undistortSize.width = undist_size->width;
  (this->super_BaseModel).undistortSize.height = undist_size->height;
  pMVar2 = &(this->super_BaseModel).cameraMatrix;
  local_100.sz.width = 0;
  local_100.sz.height = 0;
  local_100.flags = 0x1010000;
  pMVar3 = &(this->super_BaseModel).distortCoeffs;
  local_118.sz.width = 0;
  local_118.sz.height = 0;
  local_118.flags = 0x1010000;
  local_118.obj = pMVar3;
  local_100.obj = pMVar2;
  p_Var7 = (_InputArray *)cv::noArray();
  pSVar4 = &(this->super_BaseModel).undistortSize;
  local_d8.sz.width = 0;
  local_d8.sz.height = 0;
  local_d8.flags = 0x2010000;
  local_d8.obj = &new_camera_matrix;
  cv::fisheye::estimateNewCameraMatrixForUndistortRectify
            (&local_100,&local_118,(Size_ *)pSVar1,p_Var7,(_OutputArray *)&local_d8,0.0,
             (Size_ *)pSVar4,1.0);
  dVar8 = (double)(~-(ulong)((double)local_e8._0_8_ == 0.0) & local_e8._0_8_ |
                  (ulong)((uint)(-(ulong)((double)local_e8._0_8_ == 0.0) >> 0x20) & 0x3ff00000) <<
                  0x20);
  (this->super_BaseModel).undistortScale = dVar8;
  *(float *)new_camera_matrix.data = (float)((double)*(float *)new_camera_matrix.data * dVar8);
  sVar6 = *new_camera_matrix.step.p;
  *(float *)(new_camera_matrix.data + sVar6 + 4) =
       (float)((double)*(float *)(new_camera_matrix.data + sVar6 + 4) * dVar8);
  fVar5 = undist_offset->x;
  (this->super_BaseModel).undistortOffset.x = fVar5;
  (this->super_BaseModel).undistortOffset.y = undist_offset->y;
  *(float *)(new_camera_matrix.data + 8) = fVar5 + *(float *)(new_camera_matrix.data + 8);
  *(float *)(new_camera_matrix.data + sVar6 + 8) =
       (this->super_BaseModel).undistortOffset.y + *(float *)(new_camera_matrix.data + sVar6 + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=== new_camera_matrix ===\n",0x1a);
  cv::operator<<((ostream *)&std::cout,&new_camera_matrix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  local_100.sz.width = 0;
  local_100.sz.height = 0;
  local_100.flags = 0x1010000;
  local_118.sz.width = 0;
  local_118.sz.height = 0;
  local_118.flags = 0x1010000;
  local_118.obj = pMVar3;
  local_100.obj = pMVar2;
  p_Var7 = (_InputArray *)cv::noArray();
  local_d8.sz.width = 0;
  local_d8.sz.height = 0;
  local_d8.flags = 0x1010000;
  local_48.super__InputArray.obj = &(this->super_BaseModel).xMap;
  local_48.super__InputArray.sz.width = 0;
  local_48.super__InputArray.sz.height = 0;
  local_48.super__InputArray.flags = 0x2010000;
  local_60.super__InputArray.obj = &(this->super_BaseModel).yMap;
  local_60.super__InputArray.sz.width = 0;
  local_60.super__InputArray.sz.height = 0;
  local_60.super__InputArray.flags = 0x2010000;
  local_d8.obj = &new_camera_matrix;
  cv::fisheye::initUndistortRectifyMap
            (&local_100,&local_118,p_Var7,&local_d8,(Size_ *)pSVar4,5,&local_48,&local_60);
  cv::Mat::~Mat(&new_camera_matrix);
  return;
}

Assistant:

void setUndistortParams(
    const int undist_flags=0,
    const cv::Size& undist_size=cv::Size(0,0),
    const double undist_scale=0.9,
    const cv::Point2f& undist_offset=cv::Point2f(0,0)
  ) {
    cv::Mat new_camera_matrix;

    this->undistortSize = (undist_size == cv::Size(0,0) ? this->imageSize : undist_size);
    cv::fisheye::estimateNewCameraMatrixForUndistortRectify(
      this->cameraMatrix,
      this->distortCoeffs,
      this->imageSize,
      cv::noArray(),
      new_camera_matrix,
      0,
      this->undistortSize,
      1.0
    );

    this->undistortScale = (undist_scale == 0 ? 1.0 : undist_scale);
    new_camera_matrix.at<float>(0,0) *= this->undistortScale;
    new_camera_matrix.at<float>(1,1) *= this->undistortScale;
    
    this->undistortOffset = undist_offset;
    new_camera_matrix.at<float>(0,2) += this->undistortOffset.x;
    new_camera_matrix.at<float>(1,2) += this->undistortOffset.y;

    std::cout << "=== new_camera_matrix ===\n" << new_camera_matrix << "\n";
    
    cv::fisheye::initUndistortRectifyMap(
      this->cameraMatrix,
      this->distortCoeffs,
      cv::noArray(),
      new_camera_matrix,
      this->undistortSize,
      CV_32FC1,
      this->xMap,
      this->yMap
    );
  }